

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

void __thiscall
duckdb::Connection::
CreateAggregateFunction<duckdb::UDFAverageFunction,duckdb::udf_avg_state_t<int>,int,int>
          (Connection *this,string *name,LogicalType *ret_type,LogicalType *input_type_a)

{
  AggregateFunction *pAVar1;
  AggregateFunction *in_RDI;
  AggregateFunction function;
  shared_ptr<duckdb::ClientContext,_true> *in_stack_fffffffffffffd40;
  LogicalType local_2a8 [16];
  LogicalType *in_stack_fffffffffffffd68;
  LogicalType *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  undefined1 local_280 [304];
  AggregateFunction local_150;
  
  pAVar1 = &local_150;
  UDFWrapper::
  CreateAggregateFunction<duckdb::UDFAverageFunction,duckdb::udf_avg_state_t<int>,int,int>
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  AggregateFunction::AggregateFunction(pAVar1,in_RDI);
  pAVar1 = (AggregateFunction *)
           shared_ptr<duckdb::ClientContext,_true>::operator*(in_stack_fffffffffffffd40);
  duckdb::LogicalType::LogicalType(local_2a8,INVALID);
  duckdb::UDFWrapper::RegisterAggrFunction(local_280,pAVar1,local_2a8);
  duckdb::LogicalType::~LogicalType(local_2a8);
  AggregateFunction::~AggregateFunction(pAVar1);
  AggregateFunction::~AggregateFunction(pAVar1);
  return;
}

Assistant:

void CreateAggregateFunction(const string &name, LogicalType ret_type, LogicalType input_type_a) {
		AggregateFunction function =
		    UDFWrapper::CreateAggregateFunction<UDF_OP, STATE, TR, TA>(name, ret_type, input_type_a);
		UDFWrapper::RegisterAggrFunction(function, *context);
	}